

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_1000_1999.cpp
# Opt level: O1

void __thiscall psy::C::ParserTester::case1026(ParserTester *this)

{
  Expectation *pEVar1;
  initializer_list<psy::C::SyntaxKind> __l;
  allocator_type local_1bb;
  SyntaxKind local_1ba;
  vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_1b8;
  string local_1a0;
  Expectation local_180;
  Expectation local_c8;
  
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"0x1.fp2","");
  Expectation::Expectation(&local_180);
  local_1ba = FloatingConstantExpression;
  __l._M_len = 1;
  __l._M_array = &local_1ba;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            (&local_1b8,__l,&local_1bb);
  pEVar1 = Expectation::AST(&local_180,&local_1b8);
  Expectation::Expectation(&local_c8,pEVar1);
  parseExpression(this,&local_1a0,&local_c8);
  if (local_c8.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<psy::C::Decl,_std::allocator<psy::C::Decl>_>::~vector(&local_c8.declarations_);
  if (local_c8.syntaxKinds_.
      super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.syntaxKinds_.
                    super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.ambiguityText_._M_dataplus._M_p != &local_c8.ambiguityText_.field_2) {
    operator_delete(local_c8.ambiguityText_._M_dataplus._M_p,
                    local_c8.ambiguityText_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8.descriptorsW_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8.descriptorsE_);
  if (local_1b8.super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.
                    super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b8.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b8.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_180.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_180.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_180.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_180.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  std::vector<psy::C::Decl,_std::allocator<psy::C::Decl>_>::~vector(&local_180.declarations_);
  if (local_180.syntaxKinds_.
      super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_180.syntaxKinds_.
                    super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_180.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_180.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.ambiguityText_._M_dataplus._M_p != &local_180.ambiguityText_.field_2) {
    operator_delete(local_180.ambiguityText_._M_dataplus._M_p,
                    local_180.ambiguityText_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_180.descriptorsW_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_180.descriptorsE_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ParserTester::case1026()
{
    parseExpression("0x1.fp2",
                    Expectation().AST( { SyntaxKind::FloatingConstantExpression }));
}